

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O0

void sort_rec(int *array,int size,_func_int_void_ptr_void_ptr *comp)

{
  int iVar1;
  int local_30;
  int local_2c;
  int j;
  int i;
  int tmp;
  int pivot;
  _func_int_void_ptr_void_ptr *comp_local;
  int *piStack_10;
  int size_local;
  int *array_local;
  
  _tmp = comp;
  comp_local._4_4_ = size;
  piStack_10 = array;
  if (size < 0x10) {
    selectionsort(array,size,comp);
  }
  else {
    i = array[size / 2];
    local_2c = -1;
    local_30 = size;
    while( true ) {
      do {
        local_2c = local_2c + 1;
        iVar1 = (*_tmp)(piStack_10 + local_2c,&i);
      } while (iVar1 != 0);
      do {
        local_30 = local_30 + -1;
        iVar1 = (*_tmp)(&i,piStack_10 + local_30);
      } while (iVar1 != 0);
      if (local_30 <= local_2c) break;
      iVar1 = piStack_10[local_2c];
      piStack_10[local_2c] = piStack_10[local_30];
      piStack_10[local_30] = iVar1;
    }
    sort_rec(piStack_10,local_2c,_tmp);
    sort_rec(piStack_10 + local_2c,comp_local._4_4_ - local_2c,_tmp);
  }
  return;
}

Assistant:

static void sort_rec(int* array, int size, int(*comp)(const void *, const void *))
{
    if (size <= 15)
        selectionsort(array, size, comp);
    else{
        int    pivot = array[size/2];
        int    tmp;
        int    i = -1;
        int    j = size;
        for(;;){
            do i++; while(comp(array + i, &pivot));
            do j--; while(comp(&pivot, array + j));
            if (i >= j) break;
            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }
        sort_rec(array    , i     , comp);
        sort_rec(&array[i], size-i, comp);
    }
}